

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::SharedCtor(SimpleRecurrentLayerParams *this)

{
  SimpleRecurrentLayerParams *this_local;
  
  memset(&this->activation_,0,0x33);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void SimpleRecurrentLayerParams::SharedCtor() {
  ::memset(&activation_, 0, reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&activation_) + sizeof(reverseinput_));
  _cached_size_ = 0;
}